

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkTransRel(Abc_Ntk_t *pNtk,int fInputs,int fVerbose)

{
  Abc_Aig_t *pMan;
  uint uVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p1;
  Vec_Ptr_t *vPairs;
  void **ppvVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  int iVar9;
  Abc_Ntk_t *pNtkNew;
  int local_424;
  ulong local_420;
  char Buffer [1000];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0xa8,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  local_420 = (ulong)(uint)pNtk->nObjCounts[8];
  local_424 = fInputs;
  if (pNtk->nObjCounts[8] != 0) {
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pNtkNew = pNtk_00;
    sprintf(Buffer,"%s_TR",pNtk->pName);
    pcVar2 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar2;
    Abc_NtkCleanCopy(pNtk);
    for (iVar9 = 0; iVar8 = pNtk->vBoxes->nSize, iVar9 < iVar8; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        pAVar3 = Abc_NtkBox(pNtk,iVar9);
        pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
        pAVar4 = Abc_NtkCreatePi(pNtk_00);
        (pAVar3->field_6).pCopy = pAVar4;
        pcVar2 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
      }
    }
    for (iVar9 = 0; iVar9 < iVar8; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar9);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        pAVar3 = Abc_NtkBox(pNtk,iVar9);
        pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
        pAVar4 = Abc_NtkCreatePi(pNtk_00);
        pcVar2 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
      }
      iVar8 = pNtk->vBoxes->nSize;
    }
    for (iVar9 = 0; iVar9 < pNtk->vPis->nSize; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar9);
      Abc_NtkDupObj(pNtk_00,pAVar3,1);
    }
    Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
    pAVar3 = Abc_AigConst1(pNtk_00);
    pAVar4 = Abc_AigConst1(pNtk);
    (pAVar4->field_6).pCopy = pAVar3;
    for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar9);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar4 = Abc_ObjChild0Copy(pAVar3);
        p1 = Abc_ObjChild1Copy(pAVar3);
        pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
        (pAVar3->field_6).pCopy = pAVar4;
      }
    }
    iVar9 = pNtk->vBoxes->nSize;
    if (iVar9 == pNtk->nObjCounts[8]) {
      uVar1 = (int)local_420 * 2;
      vPairs = (Vec_Ptr_t *)malloc(0x10);
      ppvVar6 = (void **)0x8;
      if (8 < uVar1) {
        ppvVar6 = (void **)(ulong)uVar1;
      }
      vPairs->nSize = 0;
      vPairs->nCap = (int)ppvVar6;
      ppvVar5 = (void **)malloc((long)(int)ppvVar6 << 3);
      vPairs->pArray = ppvVar5;
      for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
        pAVar3 = Abc_NtkBox(pNtk,iVar8);
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
          pAVar3 = Abc_NtkBox(pNtk,iVar8);
          ppvVar6 = pAVar3->pNtk->vObjs->pArray;
          pAVar3 = Abc_ObjChild0Copy((Abc_Obj_t *)ppvVar6[*(pAVar3->vFanins).pArray]);
          Vec_PtrPush(vPairs,pAVar3);
          pAVar3 = Abc_NtkPi(pNtk_00,(int)local_420 + iVar8);
          Vec_PtrPush(vPairs,pAVar3);
        }
        iVar9 = pNtk->vBoxes->nSize;
      }
      pVVar7 = vPairs;
      pAVar3 = Abc_AigMiter((Abc_Aig_t *)pNtk_00->pManFunc,vPairs,0);
      iVar9 = (int)pVVar7;
      Vec_PtrFree(vPairs);
      pAVar4 = Abc_NtkPo(pNtk_00,iVar9);
      pAVar3 = (Abc_Obj_t *)((ulong)pAVar3 ^ 1);
      Abc_ObjAddFanin(pAVar4,pAVar3);
      pAVar3 = Abc_NtkPo(pNtk_00,(int)pAVar3);
      Abc_ObjAssignName(pAVar3,"rel",(char *)0x0);
      if (local_424 != 0) {
        iVar9 = pNtk_00->vPis->nSize;
        if (iVar9 != pNtk->vPis->nSize + uVar1) {
          __assert_fail("Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                        ,0xd5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
        }
        while (pNtk_00 = pNtkNew, (int)uVar1 < iVar9) {
          iVar9 = iVar9 + -1;
          Abc_NtkQuantify(pNtkNew,0,iVar9,(int)ppvVar6);
          Abc_NtkCleanData(pNtk_00);
          Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
          Abc_NtkSynthesize(&pNtkNew,1);
        }
        Abc_NtkCleanData(pNtkNew);
        Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
        iVar9 = pNtk_00->vPis->nSize;
        while ((int)uVar1 < iVar9) {
          iVar9 = iVar9 + -1;
          pAVar3 = Abc_NtkPi(pNtk_00,iVar9);
          if ((pAVar3->vFanouts).nSize != 0) {
            __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                          ,0xea,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
          }
          Abc_NtkDeleteObj(pAVar3);
        }
      }
      iVar9 = Abc_NtkCheck(pNtk_00);
      if (iVar9 == 0) {
        puts("Abc_NtkTransRel: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0xc5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  __assert_fail("Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                ,0xa9,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTransRel( Abc_Ntk_t * pNtk, int fInputs, int fVerbose )
{
    char Buffer[1000];
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pMiter;
    int i, nLatches;
    int fSynthesis = 1;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) );
    nLatches = Abc_NtkLatchNum(pNtk);
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    sprintf( Buffer, "%s_TR", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_NtkCleanCopy( pNtk );
    // create current state variables
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create next state variables
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), Abc_ObjName(pObj), NULL );
    // create PI variables
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create the PO
    Abc_NtkCreatePo( pNtkNew );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create the function of the primary output
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    vPairs = Vec_PtrAlloc( 2*nLatches );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPairs, Abc_NtkPi(pNtkNew, i+nLatches) );
    }
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkNew->pManFunc, vPairs, 0 );
    Vec_PtrFree( vPairs );
    // add the primary output
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), Abc_ObjNot(pMiter) );
    Abc_ObjAssignName( Abc_NtkPo(pNtkNew,0), "rel", NULL );

    // quantify inputs
    if ( fInputs )
    {
        assert( Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
//        for ( i = 2*nLatches; i < Abc_NtkPiNum(pNtkNew); i++ )
        {
            Abc_NtkQuantify( pNtkNew, 0, i, fVerbose );
//            if ( fSynthesis && (i % 3 == 2) )
            if ( fSynthesis  )
            {
                Abc_NtkCleanData( pNtkNew );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
                Abc_NtkSynthesize( &pNtkNew, 1 );
            }
//            printf( "Var = %3d. Nodes = %6d. ", Abc_NtkPiNum(pNtkNew) - 1 - i, Abc_NtkNodeNum(pNtkNew) );
//            printf( "Var = %3d. Nodes = %6d. ", i - 2*nLatches, Abc_NtkNodeNum(pNtkNew) );
        }
//        printf( "\n" );
        Abc_NtkCleanData( pNtkNew );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
        {
            pObj = Abc_NtkPi( pNtkNew, i );
            assert( Abc_ObjFanoutNum(pObj) == 0 );
            Abc_NtkDeleteObj( pObj );
        }
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTransRel: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}